

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O2

void * __thiscall
axl::io::MappedViewMgr::view
          (MappedViewMgr *this,uint64_t begin,uint64_t end,uint64_t origBegin,uint64_t origEnd)

{
  long lVar1;
  Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  old;
  ViewEntry *p;
  int *piVar2;
  Iterator IVar3;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  IVar4;
  IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  local_40;
  void *local_38;
  
  p = (ViewEntry *)operator_new(0x38);
  (p->m_view).m_p = (void *)0x0;
  (p->m_view).m_size = 0;
  (p->m_mapIt).
  super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  .
  super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
  .m_p = (Entry *)0x0;
  piVar2 = (int *)((long)this - this->m_parentOffset);
  local_38 = psx::Mapping::map(&p->m_view,(void *)0x0,end - begin,
                               (uint)((*(byte *)(piVar2 + 0x2a) & 1) == 0) * 2 + 1,1,*piVar2,begin);
  if (local_38 == (void *)0x0) {
    psx::Mapping::~Mapping(&p->m_view);
    operator_delete(p);
  }
  else {
    p->m_begin = begin;
    p->m_end = end;
    sl::
    ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
    ::insertHead((ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
                  *)this,p);
    IVar3 = sl::
            BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
            ::visit(&(this->m_viewMap).
                     super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
                    ,begin);
    if (*(long *)((long)IVar3.
                        super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                        .
                        super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                        .m_p + 0x18) != 0) {
      *(undefined8 *)
       (*(long *)((long)IVar3.
                        super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                        .
                        super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                        .m_p + 0x18) + 0x30) = 0;
    }
    (p->m_mapIt).
    super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    .
    super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
    .m_p = (Entry *)IVar3.
                    super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                    .
                    super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                    .m_p;
    *(ViewEntry **)
     ((long)IVar3.
            super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
            .
            super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
            .m_p + 0x18) = p;
    IVar4.m_p = *(Entry **)
                 IVar3.
                 super_IteratorImpl<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                 .
                 super_IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                 .m_p;
    while ((IVar4.m_p != (Entry *)0x0 &&
           (lVar1 = *(long *)((long)IVar4.m_p + 0x18), *(ulong *)(lVar1 + 0x28) <= end))) {
      local_40.m_p = IVar4.m_p;
      IVar4.m_p = (Entry *)sl::
                           IteratorBase<axl::sl::Iterator<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::ListLink>_>
                           ::getInc(&local_40,1);
      sl::
      BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
      ::erase(&(this->m_viewMap).
               super_BinTreeBase<axl::sl::RbTree<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_axl::sl::RbTreeNode<unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*,_axl::sl::Cmp<unsigned_long,_unsigned_long>,_unsigned_long,_axl::io::MappedViewMgr::ViewEntry_*>
              ,(Iterator)local_40.m_p);
      *(undefined8 *)(lVar1 + 0x30) = 0;
    }
  }
  return local_38;
}

Assistant:

void*
MappedViewMgr::view(
	uint64_t begin,
	uint64_t end,
	uint64_t origBegin,
	uint64_t origEnd
) {
	ViewEntry* viewEntry = new ViewEntry;

	MappedFile* mappedFile = getMappedFile();
	void* p;
	size_t size = (size_t)(end - begin);

#if (_AXL_OS_WIN)
	uint_t access = (mappedFile->m_fileFlags & FileFlag_ReadOnly) ?
		FILE_MAP_READ :
		FILE_MAP_READ | FILE_MAP_WRITE;

	p = viewEntry->m_view.view(mappedFile->m_mapping, access, begin, size);
#elif (_AXL_OS_POSIX)
	int protection = (mappedFile->m_fileFlags & FileFlag_ReadOnly) ?
		PROT_READ :
		PROT_READ | PROT_WRITE;

	p = viewEntry->m_view.map(
			NULL,
			size,
			protection,
			MAP_SHARED,
			mappedFile->m_file.m_file,
			begin
		);
#endif

	if (!p) {
		delete viewEntry;
		return NULL;
	}

	viewEntry->m_begin = begin;
	viewEntry->m_end = end;

	m_viewList.insertHead(viewEntry);

	// update viewmap

	ViewMap::Iterator it = m_viewMap.visit(begin);
	if (it->m_value) {
		ViewEntry* oldViewEntry = it->m_value;

		ASSERT(oldViewEntry->m_mapIt == it);
		ASSERT(oldViewEntry->m_end < end); // otherwise, we should have just used this view!

		oldViewEntry->m_mapIt = NULL; // this view is removed from the map
	}

	viewEntry->m_mapIt = it;
	it->m_value = viewEntry;

	// now, for all the old views that are completely overlapped by this new view --
	// remove them from the map (but do not unmap yet, so recent View () results still valid)

	it++;
	while (it) {
		ViewEntry* oldViewEntry = it->m_value;
		if (oldViewEntry->m_end > end) // nope, not overlapped
			break;

		ASSERT(oldViewEntry->m_mapIt == it);

		// this view is completely overlapped and is not needed for new view requests
		// remove it from map but do not delete it to make sure last N view request are still valid

		ViewMap::Iterator next = it.getInc(1);
		m_viewMap.erase(it);
		oldViewEntry->m_mapIt = NULL;

		it = next;
	}

	return p;
}